

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_print_errors_ds(arg_dstr_t ds,arg_end *end,char *progname)

{
  arg_hdr *errorparent;
  int i;
  char *progname_local;
  arg_end *end_local;
  arg_dstr_t ds_local;
  
  for (errorparent._4_4_ = 0; errorparent._4_4_ < end->count;
      errorparent._4_4_ = errorparent._4_4_ + 1) {
    if (*(long *)((long)end->parent[errorparent._4_4_] + 0x50) != 0) {
      (**(code **)((long)end->parent[errorparent._4_4_] + 0x50))
                (end->parent[errorparent._4_4_],ds,end->error[errorparent._4_4_],
                 end->argval[errorparent._4_4_],progname);
    }
  }
  return;
}

Assistant:

void arg_print_errors_ds(arg_dstr_t ds, struct arg_end* end, const char* progname) {
    int i;
    ARG_TRACE(("arg_errors()\n"));
    for (i = 0; i < end->count; i++) {
        struct arg_hdr* errorparent = (struct arg_hdr*)(end->parent[i]);
        if (errorparent->errorfn)
            errorparent->errorfn(end->parent[i], ds, end->error[i], end->argval[i], progname);
    }
}